

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShmSystemV.cpp
# Opt level: O2

void __thiscall adios2::transport::ShmSystemV::Close(ShmSystemV *this)

{
  int iVar1;
  allocator local_183;
  allocator local_182;
  allocator local_181;
  string local_180;
  string local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,"close",(allocator *)&local_180);
  Transport::ProfilerStart(&this->super_Transport,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  iVar1 = shmdt(this->m_Buffer);
  std::__cxx11::string::string((string *)&local_60,"close",(allocator *)&local_180);
  Transport::ProfilerStop(&this->super_Transport,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (iVar1 < 1) {
    std::__cxx11::string::string((string *)&local_180,"Toolkit",&local_181);
    std::__cxx11::string::string((string *)&local_c0,"transport::shm::ShmSystemV",&local_182);
    std::__cxx11::string::string((string *)&local_e0,"Close",&local_183);
    std::__cxx11::to_string(&local_160,this->m_Size);
    std::operator+(&local_140,"failed to detach shared memory segment of size ",&local_160);
    std::operator+(&local_120,&local_140," and name ");
    std::operator+(&local_100,&local_120,&(this->super_Transport).m_Name);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_180,&local_c0,&local_e0,&local_100,-1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_180);
  }
  if (this->m_RemoveAtClose == true) {
    std::__cxx11::string::string((string *)&local_80,"close",(allocator *)&local_180);
    Transport::ProfilerStart(&this->super_Transport,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    iVar1 = shmctl(this->m_ShmID,0,(shmid_ds *)0x0);
    std::__cxx11::string::string((string *)&local_a0,"close",(allocator *)&local_180);
    Transport::ProfilerStop(&this->super_Transport,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (iVar1 < 1) {
      std::__cxx11::string::string((string *)&local_180,"Toolkit",&local_181);
      std::__cxx11::string::string((string *)&local_c0,"transport::shm::ShmSystemV",&local_182);
      std::__cxx11::string::string((string *)&local_e0,"Close",&local_183);
      std::__cxx11::to_string(&local_160,this->m_Size);
      std::operator+(&local_140,"failed to remove shared memory segment of size ",&local_160);
      std::operator+(&local_120,&local_140," and name ");
      std::operator+(&local_100,&local_120,&(this->super_Transport).m_Name);
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_180,&local_c0,&local_e0,&local_100,-1)
      ;
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_180);
    }
  }
  (this->super_Transport).m_IsOpen = false;
  return;
}

Assistant:

void ShmSystemV::Close()
{
    ProfilerStart("close");
    int result = shmdt(m_Buffer);
    ProfilerStop("close");
    if (result < 1)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::shm::ShmSystemV", "Close",
                                              "failed to detach shared memory segment of size " +
                                                  std::to_string(m_Size) + " and name " + m_Name);
    }

    if (m_RemoveAtClose)
    {
        ProfilerStart("close");
        const int remove = shmctl(m_ShmID, IPC_RMID, NULL);
        ProfilerStop("close");
        if (remove < 1)
        {
            helper::Throw<std::ios_base::failure>(
                "Toolkit", "transport::shm::ShmSystemV", "Close",
                "failed to remove shared memory segment of size " + std::to_string(m_Size) +
                    " and name " + m_Name);
        }
    }

    m_IsOpen = false;
}